

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O2

int Gia_ManFindSharedNode(Gia_Man_t *pNew,Vec_Int_t *vSuper,int iLit0)

{
  int iVar1;
  int iVar2;
  int Lit;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if ((long)vSuper->nSize < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x1f8,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  iVar4 = vSuper->pArray[(long)vSuper->nSize + -1];
  iVar1 = Abc_Lit2Var(iVar4);
  iVar2 = Gia_ObjLevelId(pNew,iVar1);
  iVar1 = vSuper->nSize;
  do {
    iVar5 = iVar1;
    if (iVar5 < 1) goto LAB_0055be9d;
    Lit = Vec_IntEntry(vSuper,iVar5 + -1);
    iVar1 = Abc_Lit2Var(Lit);
    iVar1 = Gia_ObjLevelId(pNew,iVar1);
    if (iVar2 != iVar1) goto LAB_0055be9d;
    iVar1 = Abc_Lit2Var(iLit0);
    iVar3 = Abc_Lit2Var(Lit);
    if (iVar1 == iVar3) break;
    iVar3 = Gia_ManHashLookupInt(pNew,iLit0,Lit);
    iVar1 = iVar5 + -1;
  } while (iVar3 == 0);
  if (Lit != iVar4) {
    Vec_IntWriteEntry(vSuper,iVar5 + -1,iVar4);
    Vec_IntWriteEntry(vSuper,vSuper->nSize + -1,Lit);
  }
LAB_0055be9d:
  iVar4 = Vec_IntPop(vSuper);
  return iVar4;
}

Assistant:

int Gia_ManFindSharedNode( Gia_Man_t * pNew, Vec_Int_t * vSuper, int iLit0 )
{
    int i, iLit1 = Vec_IntEntryLast(vSuper);
    // iterate through the nodes whose level is equal to that of the last one
    int iLit1Level = Gia_ObjLevelId(pNew, Abc_Lit2Var(iLit1));
    for ( i = Vec_IntSize(vSuper)-1; i >= 0; i-- )
    {
        int iLit2 = Vec_IntEntry(vSuper, i);
        if ( iLit1Level != Gia_ObjLevelId(pNew, Abc_Lit2Var(iLit2)) )
            break;
        if ( Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit2) && !Gia_ManHashLookupInt(pNew, iLit0, iLit2) ) // new node
            continue;
        // swap iLit2 and iLit1
        if ( iLit2 != iLit1 )
        {
            Vec_IntWriteEntry( vSuper, i, iLit1 );
            Vec_IntWriteEntry( vSuper, Vec_IntSize(vSuper)-1, iLit2 );
        }
        break;
    }
    return Vec_IntPop(vSuper);    
}